

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Block::GetTime(Block *this,Cluster *pCluster)

{
  undefined1 auVar1 [16];
  longlong lVar2;
  SegmentInfo *this_00;
  longlong lVar3;
  undefined8 *in_RSI;
  longlong ns;
  longlong scale;
  SegmentInfo *pInfo;
  Segment *pSegment;
  longlong tc;
  Cluster *in_stack_ffffffffffffffd0;
  Block *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  lVar2 = GetTimeCode(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  this_00 = Segment::GetInfo((Segment *)*in_RSI);
  lVar3 = SegmentInfo::GetTimeCodeScale(this_00);
  if ((lVar2 == 0) ||
     (auVar1._8_8_ = 0, auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8),
     lVar3 <= SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar2),0))) {
    local_8 = lVar2 * lVar3;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

long long Block::GetTime(const Cluster* pCluster) const {
  assert(pCluster);

  const long long tc = GetTimeCode(pCluster);

  const Segment* const pSegment = pCluster->m_pSegment;
  const SegmentInfo* const pInfo = pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  // Check if tc * scale could overflow.
  if (tc != 0 && scale > LLONG_MAX / tc) {
    return -1;
  }
  const long long ns = tc * scale;

  return ns;
}